

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  int iVar1;
  _Alloc_hider str;
  bool bVar2;
  char **in_RDX;
  char **extraout_RDX;
  string *str_00;
  int iVar3;
  long lVar4;
  string flagfile_value;
  string arg_string;
  long lVar5;
  
  flagfile_value._M_dataplus._M_p = (pointer)&flagfile_value.field_2;
  flagfile_value._M_string_length = 0;
  flagfile_value.field_2._M_local_buf[0] = '\0';
  iVar3 = 1;
  str_00 = (string *)argc;
  do {
    if (*argc <= iVar3) {
      if (g_help_flag != '\0') {
        PrintColorEncoded((char *)str_00);
      }
      std::__cxx11::string::~string((string *)&flagfile_value);
      return;
    }
    StreamableToString<char*>(&arg_string,(internal *)(argv + iVar3),in_RDX);
    str = arg_string._M_dataplus;
    bVar2 = ParseGoogleTestFlag(arg_string._M_dataplus._M_p);
    if (bVar2) {
LAB_00177613:
      iVar1 = *argc;
      lVar5 = (long)iVar3;
      while (lVar4 = lVar5 + 1, lVar4 < iVar1) {
        argv[lVar5] = argv[lVar4];
        lVar5 = lVar4;
      }
      *argc = iVar1 + -1;
      argv[(long)iVar1 + -1] = (char *)0x0;
      iVar3 = iVar3 + -1;
    }
    else {
      bVar2 = ParseFlag<std::__cxx11::string>(str._M_p,"flagfile",&flagfile_value);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)FLAGS_gtest_flagfile_abi_cxx11_);
        LoadFlagsFromFile(&flagfile_value);
        goto LAB_00177613;
      }
      bVar2 = std::operator==(&arg_string,"--help");
      if (bVar2) {
LAB_00177667:
        g_help_flag = '\x01';
      }
      else {
        bVar2 = HasGoogleTestFlagPrefix((char *)0x177663);
        if (bVar2) goto LAB_00177667;
      }
    }
    str_00 = &arg_string;
    std::__cxx11::string::~string((string *)&arg_string);
    iVar3 = iVar3 + 1;
    in_RDX = extraout_RDX;
  } while( true );
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  std::string flagfile_value;
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_ && GTEST_HAS_FILE_SYSTEM
    } else if (ParseFlag(arg, "flagfile", &flagfile_value)) {
      GTEST_FLAG_SET(flagfile, flagfile_value);
      LoadFlagsFromFile(flagfile_value);
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_ && GTEST_HAS_FILE_SYSTEM
    } else if (arg_string == "--help" || HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.
      for (int j = i + 1; j < *argc; ++j) {
        argv[j - 1] = argv[j];
      }

      // Decrements the argument count.
      (*argc)--;

      // Terminate the array with nullptr.
      argv[*argc] = nullptr;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}